

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall
diy::Master::Master(Master *this,communicator *comm,int threads__,int limit__,CreateBlock *create_,
                   DestroyBlock *destroy_,ExternalStorage *storage,SaveBlock *save,LoadBlock *load_,
                   QueuePolicy *q_policy)

{
  communicator *other;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  int in_ECX;
  int in_EDX;
  Master *in_RDI;
  ExternalStorage *in_stack_00000008;
  QueuePolicy *in_stack_00000020;
  mt19937 gen;
  uint s;
  random_device rd;
  undefined4 in_stack_ffffffffffffd748;
  undefined4 in_stack_ffffffffffffd74c;
  result_type_conflict rVar1;
  communicator *in_stack_ffffffffffffd750;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffd758;
  undefined4 in_stack_ffffffffffffd760;
  undefined4 in_stack_ffffffffffffd764;
  unique_ptr<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>
  *this_01;
  communicator *this_02;
  Load *in_stack_ffffffffffffd7a8;
  Save *in_stack_ffffffffffffd7b0;
  ExternalStorage *in_stack_ffffffffffffd7b8;
  Destroy *in_stack_ffffffffffffd7c0;
  undefined4 in_stack_ffffffffffffd7c8;
  undefined4 in_stack_ffffffffffffd7cc;
  Collection *in_stack_ffffffffffffd7d0;
  undefined1 local_27d0 [5004];
  result_type_conflict local_1444;
  int local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::vector<diy::Link_*,_std::allocator<diy::Link_*>_>::vector
            ((vector<diy::Link_*,_std::allocator<diy::Link_*>_> *)0x114ebd);
  std::function<void_*()>::function
            ((function<void_*()> *)CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
             (function<void_*()> *)in_stack_ffffffffffffd758);
  std::function<void_(void_*)>::function
            ((function<void_(void_*)> *)
             CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
             (function<void_(void_*)> *)in_stack_ffffffffffffd758);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)
             CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
             (function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffd758);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)
             CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),in_stack_ffffffffffffd758
            );
  Collection::Collection
            (in_stack_ffffffffffffd7d0,
             (Create *)CONCAT44(in_stack_ffffffffffffd7cc,in_stack_ffffffffffffd7c8),
             in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8,in_stack_ffffffffffffd7b0,
             in_stack_ffffffffffffd7a8);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x114f81);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x114f8e);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x114f9b);
  std::function<void_*()>::~function((function<void_*()> *)0x114fa8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x114fc4);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x114fe0)
  ;
  in_RDI->queue_policy_ = in_stack_00000020;
  in_RDI->limit_ = local_18;
  if (local_14 == -1) {
    local_14 = std::thread::hardware_concurrency();
  }
  in_RDI->threads_ = local_14;
  in_RDI->storage_ = in_stack_00000008;
  mpi::communicator::communicator(in_stack_ffffffffffffd750);
  this_02 = (communicator *)&in_RDI->incoming_;
  std::
  map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
  ::map((map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
         *)0x11508c);
  std::
  map<int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
  ::map((map<int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
         *)0x1150a5);
  operator_new(0x18);
  InFlightSendsList::InFlightSendsList((InFlightSendsList *)0x1150d3);
  std::
  unique_ptr<diy::Master::InFlightSendsList,std::default_delete<diy::Master::InFlightSendsList>>::
  unique_ptr<std::default_delete<diy::Master::InFlightSendsList>,void>
            ((unique_ptr<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>
              *)in_stack_ffffffffffffd750,
             (pointer)CONCAT44(in_stack_ffffffffffffd74c,in_stack_ffffffffffffd748));
  this_01 = &in_RDI->inflight_recvs_;
  other = (communicator *)operator_new(0x30);
  InFlightRecvsMap::InFlightRecvsMap((InFlightRecvsMap *)0x115110);
  std::unique_ptr<diy::Master::InFlightRecvsMap,std::default_delete<diy::Master::InFlightRecvsMap>>
  ::unique_ptr<std::default_delete<diy::Master::InFlightRecvsMap>,void>
            ((unique_ptr<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>
              *)in_stack_ffffffffffffd750,
             (pointer)CONCAT44(in_stack_ffffffffffffd74c,in_stack_ffffffffffffd748));
  operator_new(0x30);
  CollectivesMap::CollectivesMap((CollectivesMap *)0x11514d);
  std::unique_ptr<diy::Master::CollectivesMap,std::default_delete<diy::Master::CollectivesMap>>::
  unique_ptr<std::default_delete<diy::Master::CollectivesMap>,void>
            ((unique_ptr<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>
              *)in_stack_ffffffffffffd750,
             (pointer)CONCAT44(in_stack_ffffffffffffd74c,in_stack_ffffffffffffd748));
  in_RDI->expected_ = 0;
  in_RDI->exchange_round_ = -1;
  in_RDI->immediate_ = true;
  std::
  vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ::vector((vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
            *)0x115190);
  tthread::fast_mutex::fast_mutex(&in_RDI->add_mutex_);
  get_logger();
  stats::Profiler::Profiler((Profiler *)0x1151da);
  stats::Annotation::Annotation((Annotation *)&in_RDI->field_0x2a0,"diy.exchange-round");
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x11520b);
  mpi::communicator::duplicate(this_02,other);
  std::random_device::random_device((random_device *)this_01);
  local_1444 = std::random_device::operator()((random_device *)0x115247);
  communicator(in_RDI);
  mpi::broadcast<unsigned_int>
            (in_stack_ffffffffffffd750,
             (uint *)CONCAT44(in_stack_ffffffffffffd74c,in_stack_ffffffffffffd748),0);
  rVar1 = local_1444;
  this_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)communicator(in_RDI);
  mpi::communicator::rank((communicator *)this_00);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this_00,CONCAT44(rVar1,in_stack_ffffffffffffd748));
  memcpy(&in_RDI->mt_gen,local_27d0,5000);
  std::random_device::~random_device((random_device *)0x1152f2);
  return;
}

Assistant:

diy::Master::
Master(mpi::communicator    comm,
       int                  threads__,
       int                  limit__,
       CreateBlock          create_,
       DestroyBlock         destroy_,
       ExternalStorage*     storage,
       SaveBlock            save,
       LoadBlock            load_,
       QueuePolicy*         q_policy):
  blocks_(create_, destroy_, storage, save, load_),
  queue_policy_(q_policy),
  limit_(limit__),
#if !defined(DIY_NO_THREADS)
  threads_(threads__ == -1 ? static_cast<int>(thread::hardware_concurrency()) : threads__),
#else
  threads_(1),
#endif
  storage_(storage),
  // Communicator functionality
  inflight_sends_(new InFlightSendsList),
  inflight_recvs_(new InFlightRecvsMap),
  collectives_(new CollectivesMap)
{
#ifdef DIY_NO_THREADS
  (void) threads__;
#endif
    comm_.duplicate(comm);

    // seed random number generator, broadcast seed, offset by rank
    std::random_device rd;                      // seed source for the random number engine
    unsigned int s = rd();
    diy::mpi::broadcast(communicator(), s, 0);
    std::mt19937 gen(s + communicator().rank());          // mersenne_twister random number generator
    mt_gen = gen;
}